

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O2

bool __thiscall spvtools::opt::LoopPeeling::CanPeelLoop(LoopPeeling *this)

{
  BasicBlock *this_00;
  bool bVar1;
  uint32_t blk_id;
  CFG *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  
  this_01 = IRContext::cfg(this->context_);
  if ((((this->loop_iteration_count_ != (Instruction *)0x0) && (this->int_type_ != (Integer *)0x0))
      && (*(int *)&(this->int_type_->super_Type).field_0x24 == 0x20)) &&
     ((bVar1 = Loop::IsLCSSA(this->loop_), bVar1 &&
      (this_00 = this->loop_->loop_merge_, this_00 != (BasicBlock *)0x0)))) {
    blk_id = BasicBlock::id(this_00);
    pvVar2 = CFG::preds(this_01,blk_id);
    if (((long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start == 4) &&
       (bVar1 = IsConditionCheckSideEffectFree(this), bVar1)) {
      bVar1 = std::
              any_of<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>,false,false>,spvtools::opt::LoopPeeling::CanPeelLoop()const::_lambda(std::pair<unsigned_int,spvtools::opt::Instruction*>)_1_>
                        ((this->exit_value_)._M_h._M_before_begin._M_nxt,0);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool CanPeelLoop() const {
    CFG& cfg = *context_->cfg();

    if (!loop_iteration_count_) {
      return false;
    }
    if (!int_type_) {
      return false;
    }
    if (int_type_->width() != 32) {
      return false;
    }
    if (!loop_->IsLCSSA()) {
      return false;
    }
    if (!loop_->GetMergeBlock()) {
      return false;
    }
    if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
      return false;
    }
    if (!IsConditionCheckSideEffectFree()) {
      return false;
    }

    return !std::any_of(exit_value_.cbegin(), exit_value_.cend(),
                        [](std::pair<uint32_t, Instruction*> it) {
                          return it.second == nullptr;
                        });
  }